

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseImmediate(MipsParser *this,Parser *parser,Expression *dest)

{
  _List_node_base *p_Var1;
  bool bVar2;
  Token *pTVar3;
  MipsParser *this_00;
  MipsRegisterValue tempValue;
  Expression local_70;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  p_Var1 = (((parser->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  this_00 = (MipsParser *)parser;
  pTVar3 = Parser::peekToken(parser,0);
  if (pTVar3->type == LParen) {
    this_00 = (MipsParser *)parser;
    Parser::eatToken(parser);
  }
  local_50._M_p = (pointer)&local_40;
  local_40._M_allocated_capacity = 0;
  local_40._8_8_ = 0;
  local_48 = 0;
  bVar2 = parseRegister(this_00,parser,(MipsRegisterValue *)local_58);
  (((parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
  if (bVar2) {
    bVar2 = false;
  }
  else {
    Parser::parseExpression(&local_70,parser);
    Expression::operator=(dest,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_70.expression.
                super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar2 = (dest->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool MipsParser::parseImmediate(Parser& parser, Expression& dest)
{
	// check for (reg) or reg sequence
	TokenizerPosition pos = parser.getTokenizer()->getPosition();

	bool hasParen = parser.peekToken().type == TokenType::LParen;
	if (hasParen)
		parser.eatToken();

	MipsRegisterValue tempValue;
	bool isRegister = parseRegister(parser,tempValue);
	parser.getTokenizer()->setPosition(pos);

	if (isRegister)
		return false;

	dest = parser.parseExpression();
	return dest.isLoaded();
}